

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O3

void co_set_env_list(char **name,size_t cnt)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 *puVar4;
  char *pcVar5;
  ulong uVar6;
  ulong __nmemb;
  undefined8 *puVar7;
  size_t sVar8;
  long lVar9;
  undefined8 *puVar10;
  
  if (_ZL11g_co_sysenv_0 == (undefined8 *)0x0) {
    puVar4 = (undefined8 *)calloc(1,cnt << 4);
    __nmemb = _ZL11g_co_sysenv_1;
    _ZL11g_co_sysenv_0 = puVar4;
    if (cnt != 0) {
      sVar8 = 0;
      uVar6 = _ZL11g_co_sysenv_1;
      do {
        pcVar5 = name[sVar8];
        __nmemb = uVar6;
        if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
          pcVar5 = strdup(pcVar5);
          __nmemb = uVar6 + 1;
          _ZL11g_co_sysenv_1 = __nmemb;
          puVar4[uVar6 * 2] = pcVar5;
        }
        sVar8 = sVar8 + 1;
        uVar6 = __nmemb;
      } while (cnt != sVar8);
    }
    if (1 < __nmemb) {
      qsort(puVar4,__nmemb,0x10,co_sysenv_comp);
      puVar2 = _ZL11g_co_sysenv_0;
      puVar4 = _ZL11g_co_sysenv_0;
      if (1 < _ZL11g_co_sysenv_1) {
        lVar9 = _ZL11g_co_sysenv_1 - 1;
        puVar7 = _ZL11g_co_sysenv_0;
        puVar10 = _ZL11g_co_sysenv_0;
        do {
          iVar3 = strcmp((char *)*puVar7,(char *)puVar10[2]);
          puVar4 = puVar7;
          if ((iVar3 != 0) && (puVar4 = puVar7 + 2, puVar10 != puVar7)) {
            uVar1 = puVar10[3];
            *puVar4 = puVar10[2];
            puVar7[3] = uVar1;
          }
          lVar9 = lVar9 + -1;
          puVar7 = puVar4;
          puVar10 = puVar10 + 2;
        } while (lVar9 != 0);
      }
      _ZL11g_co_sysenv_1 = ((long)puVar4 - (long)puVar2 >> 4) + 1;
    }
    return;
  }
  return;
}

Assistant:

void co_set_env_list( const char *name[],size_t cnt)
{
	if( g_co_sysenv.data )
	{
		return ;
	}
	g_co_sysenv.data = (stCoSysEnv_t*)calloc( 1,sizeof(stCoSysEnv_t) * cnt  );

	for(size_t i=0;i<cnt;i++)
	{
		if( name[i] && name[i][0] )
		{
			g_co_sysenv.data[ g_co_sysenv.cnt++ ].name = strdup( name[i] );
		}
	}
	if( g_co_sysenv.cnt > 1 )
	{
		qsort( g_co_sysenv.data,g_co_sysenv.cnt,sizeof(stCoSysEnv_t),co_sysenv_comp );
		stCoSysEnv_t *lp = g_co_sysenv.data;
		stCoSysEnv_t *lq = g_co_sysenv.data + 1;
		for(size_t i=1;i<g_co_sysenv.cnt;i++)
		{
			if( strcmp( lp->name,lq->name ) )
			{
				++lp;
				if( lq != lp  )
				{
					*lp = *lq;
				}
			}
			++lq;
		}
		g_co_sysenv.cnt = lp - g_co_sysenv.data + 1;
	}

}